

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O3

int utf8_isInvalid3(ENCODING *enc,char *p)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  
  bVar1 = p[2];
  if (-1 < (char)bVar1) {
    return 1;
  }
  cVar2 = *p;
  if (cVar2 == -0x11) {
    bVar3 = p[1];
    if (bVar3 != 0xbf) {
      if (0xbf < bVar1) {
        return 1;
      }
      goto LAB_00580fe7;
    }
    bVar3 = 0xbf;
    if (0xbd < bVar1) {
      return 1;
    }
  }
  else {
    if (0xbf < bVar1) {
      return 1;
    }
    bVar3 = p[1];
    if (cVar2 == -0x20) {
      bVar4 = (byte)(bVar3 + 0x40) < 0xe0;
      goto LAB_00580ffd;
    }
LAB_00580fe7:
    bVar4 = true;
    if (-1 < (char)bVar3) goto LAB_00580ffd;
  }
  bVar4 = (byte)((cVar2 != -0x13) << 5 | 0x9fU) < bVar3;
LAB_00580ffd:
  return (int)bVar4;
}

Assistant:

static int PTRFASTCALL
utf8_isInvalid3(const ENCODING *enc, const char *p) {
  UNUSED_P(enc);
  return UTF8_INVALID3((const unsigned char *)p);
}